

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.cc
# Opt level: O3

int __thiscall tvm::runtime::GraphRuntime::GetInputIndex(GraphRuntime *this,string *name)

{
  uint uVar1;
  pointer puVar2;
  pointer pNVar3;
  pointer __s2;
  size_t __n;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  LogMessage local_48;
  
  puVar2 = (this->input_nodes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->input_nodes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 2;
    pNVar3 = (this->nodes_).
             super__Vector_base<tvm::runtime::GraphRuntime::Node,_std::allocator<tvm::runtime::GraphRuntime::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    lVar7 = 0;
    do {
      uVar1 = puVar2[lVar7];
      if (pNVar3[uVar1].name._M_string_length == __n) {
        if (__n == 0) goto LAB_0011006f;
        iVar4 = bcmp(pNVar3[uVar1].name._M_dataplus._M_p,__s2,__n);
        if (iVar4 == 0) goto LAB_0011006f;
      }
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  dmlc::LogMessage::LogMessage
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
             ,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_48.log_stream_,"Warning: cannot find \"",0x16);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_48.log_stream_,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" among input",0xd);
  dmlc::LogMessage::~LogMessage(&local_48);
  lVar7 = 0xffffffff;
LAB_0011006f:
  return (int)lVar7;
}

Assistant:

int GraphRuntime::GetInputIndex(const std::string &name) {
  for (size_t i = 0; i < input_nodes_.size(); ++i) {
    uint32_t nid = input_nodes_[i];
    if (nodes_[nid].name == name) {
      return static_cast<int>(i);
    }
  }
  LOG(WARNING) << "Warning: cannot find \"" << name << "\" among input";
  return -1;
}